

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioButton.cpp
# Opt level: O0

void __thiscall gui::RadioButton::setChecked(RadioButton *this,bool checked)

{
  bool bVar1;
  Container *pCVar2;
  __shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  byte in_SIL;
  Widget *in_RDI;
  RadioButton *childButton;
  shared_ptr<gui::Widget> *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *__range1;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
  *in_stack_ffffffffffffffa8;
  Widget *in_stack_ffffffffffffffb0;
  __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
  local_20;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if ((*(byte *)((long)&in_RDI[1].transformable_.m_origin.x + 1) & 1) != local_9) {
    *(byte *)((long)&in_RDI[1].transformable_.m_origin.x + 1) = local_9;
    Widget::requestRedraw(in_stack_ffffffffffffffb0);
  }
  if (((local_9 & 1) != 0) && (pCVar2 = Widget::getParent(in_RDI), pCVar2 != (Container *)0x0)) {
    pCVar2 = Widget::getParent(in_RDI);
    local_18 = ContainerBase::getChildren(&pCVar2->super_ContainerBase);
    local_20._M_current =
         (shared_ptr<gui::Widget> *)
         std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::
         begin(in_stack_ffffffffffffffa8);
    std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::end
              (in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      this_00 = &__gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                 ::operator*(&local_20)->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>
      ;
      peVar3 = std::__shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
      if (peVar3 == (element_type *)0x0) {
        in_stack_ffffffffffffffb0 = (Widget *)0x0;
      }
      else {
        in_stack_ffffffffffffffb0 = (Widget *)__dynamic_cast(peVar3,&Widget::typeinfo,&typeinfo,0);
      }
      if (((in_stack_ffffffffffffffb0 != (Widget *)0x0) &&
          (((uint)in_stack_ffffffffffffffb0[1].transformable_.m_origin.x & 0x100) != 0)) &&
         (in_stack_ffffffffffffffb0 != in_RDI)) {
        *(undefined1 *)((long)&in_stack_ffffffffffffffb0[1].transformable_.m_origin.x + 1) = 0;
        Widget::requestRedraw(in_stack_ffffffffffffffb0);
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void RadioButton::setChecked(bool checked) {
    if (isChecked_ != checked) {
        isChecked_ = checked;
        requestRedraw();
    }

    if (!checked || getParent() == nullptr) {
        return;
    }
    for (const auto& child : getParent()->getChildren()) {
        auto childButton = dynamic_cast<RadioButton*>(child.get());
        if (childButton != nullptr && childButton->isChecked_ && childButton != this) {
            childButton->isChecked_ = false;
            requestRedraw();
        }
    }
}